

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_comp_init(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos1043;
  int iVar6;
  code *action;
  char *name;
  int iVar7;
  int yypos1043;
  
  iVar5 = G->pos;
  iVar4 = G->thunkpos;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar3 = G->pos;
  iVar6 = G->thunkpos;
  iVar1 = yy_BOM(G);
  if (iVar1 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar6;
    iVar1 = iVar3;
    iVar7 = iVar6;
  }
  else {
    iVar1 = G->pos;
    iVar7 = G->thunkpos;
  }
  iVar2 = yy_pod(G);
  if (iVar2 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar7;
  }
  iVar1 = yy_statementlist(G);
  if (iVar1 != 0) {
    yyDo(G,yySet,-1,0,"yySet");
    yy__(G);
    iVar1 = yy_end_of_file(G);
    if (iVar1 != 0) {
      iVar5 = G->begin;
      iVar4 = G->end;
      action = yy_1_comp_init;
      name = "yy_1_comp_init";
      goto LAB_00103d84;
    }
  }
  G->pos = iVar3;
  G->thunkpos = iVar6;
  iVar1 = yy_BOM(G);
  if (iVar1 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar6;
  }
  else {
    iVar3 = G->pos;
    iVar6 = G->thunkpos;
  }
  iVar1 = yy_pod(G);
  if (iVar1 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar6;
  }
  do {
    iVar3 = G->pos;
    iVar6 = G->thunkpos;
    iVar1 = yy_ws(G);
  } while (iVar1 != 0);
  G->pos = iVar3;
  G->thunkpos = iVar6;
  iVar3 = yy_end_of_file(G);
  if (iVar3 == 0) {
    G->pos = iVar5;
    G->thunkpos = iVar4;
    return 0;
  }
  iVar5 = G->begin;
  iVar4 = G->end;
  action = yy_2_comp_init;
  name = "yy_2_comp_init";
LAB_00103d84:
  yyDo(G,action,iVar5,iVar4,name);
  yyDo(G,yyPop,1,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_comp_init(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "comp_init"));

  {  int yypos1041= G->pos, yythunkpos1041= G->thunkpos;
  {  int yypos1043= G->pos, yythunkpos1043= G->thunkpos;  if (!yy_BOM(G))  goto l1043;
  goto l1044;
  l1043:;	  G->pos= yypos1043; G->thunkpos= yythunkpos1043;
  }
  l1044:;	
  {  int yypos1045= G->pos, yythunkpos1045= G->thunkpos;  if (!yy_pod(G))  goto l1045;
  goto l1046;
  l1045:;	  G->pos= yypos1045; G->thunkpos= yythunkpos1045;
  }
  l1046:;	  if (!yy_statementlist(G))  goto l1042;
  yyDo(G, yySet, -1, 0, "yySet");
  if (!yy__(G))  goto l1042;
  if (!yy_end_of_file(G))  goto l1042;
  yyDo(G, yy_1_comp_init, G->begin, G->end, "yy_1_comp_init");
  goto l1041;
  l1042:;	  G->pos= yypos1041; G->thunkpos= yythunkpos1041;
  {  int yypos1047= G->pos, yythunkpos1047= G->thunkpos;  if (!yy_BOM(G))  goto l1047;
  goto l1048;
  l1047:;	  G->pos= yypos1047; G->thunkpos= yythunkpos1047;
  }
  l1048:;	
  {  int yypos1049= G->pos, yythunkpos1049= G->thunkpos;  if (!yy_pod(G))  goto l1049;
  goto l1050;
  l1049:;	  G->pos= yypos1049; G->thunkpos= yythunkpos1049;
  }
  l1050:;	
  l1051:;	
  {  int yypos1052= G->pos, yythunkpos1052= G->thunkpos;  if (!yy_ws(G))  goto l1052;
  goto l1051;
  l1052:;	  G->pos= yypos1052; G->thunkpos= yythunkpos1052;
  }  if (!yy_end_of_file(G))  goto l1040;
  yyDo(G, yy_2_comp_init, G->begin, G->end, "yy_2_comp_init");

  }
  l1041:;	  yyprintf((stderr, "  ok   comp_init"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l1040:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "comp_init"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}